

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O1

void __thiscall
cmSourceFile::AppendProperty(cmSourceFile *this,string *prop,char *value,bool asString)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  char *val;
  
  cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
  __n = prop->_M_string_length;
  if (__n == propGENERATED_abi_cxx11_._M_string_length) {
    if ((__n != 0) &&
       (iVar2 = bcmp((prop->_M_dataplus)._M_p,propGENERATED_abi_cxx11_._M_dataplus._M_p,__n),
       iVar2 != 0)) {
      return;
    }
    val = GetProperty(this,&propGENERATED_abi_cxx11_);
    bVar1 = cmSystemTools::IsOn(val);
    this->IsGenerated = bVar1;
  }
  return;
}

Assistant:

void cmSourceFile::AppendProperty(const std::string& prop, const char* value,
                                  bool asString)
{
  this->Properties.AppendProperty(prop, value, asString);

  // Update IsGenerated flag
  if (prop == propGENERATED) {
    this->IsGenerated = this->GetPropertyAsBool(propGENERATED);
  }
}